

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state.cpp
# Opt level: O3

void __thiscall State::advance(State *this)

{
  point p;
  
  p = this->position;
  if ((this->flags & 1) == 0) {
    p = (point)((ulong)(uint)(p.x + (this->direction).x) |
               ((ulong)p & 0xffffffff00000000) + (long)this->direction & 0xffffffff00000000);
  }
  this->position = p;
  Grid::setslime(&this->cg,p,true);
  *(byte *)&this->flags = (byte)this->flags & 0xfe;
  return;
}

Assistant:

void State::advance() {
    position = nextPos();
    cg.setslime(position, 1);
    flags &= ~SF_NON_MOVE_MATCH;
}